

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

int64_t __thiscall
TPZStructMatrixOR<std::complex<double>_>::ThreadData::NextElement(ThreadData *this)

{
  TPZCompMesh *this_00;
  TPZAdmChunkVector<TPZCompEl_*,_10> *this_01;
  int64_t iVar1;
  TPZCompEl **ppTVar2;
  size_type sVar3;
  set<int,_std::less<int>,_std::allocator<int>_> *psVar4;
  ulong uVar5;
  undefined8 *in_RDI;
  TPZCompEl *el;
  int64_t nel;
  TPZAdmChunkVector<TPZCompEl_*,_10> *elementvec;
  TPZCompMesh *cmesh;
  int64_t nextel;
  int64_t iel;
  mutex *in_stack_ffffffffffffffa0;
  TPZCompEl *pTVar6;
  undefined1 in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffb9;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long local_10;
  
  std::mutex::lock(in_stack_ffffffffffffffa0);
  this_00 = ::TPZStructMatrix::Mesh((TPZStructMatrix *)*in_RDI);
  this_01 = TPZCompMesh::ElementVec(this_00);
  iVar1 = TPZChunkVector<TPZCompEl_*,_10>::NElements
                    (&this_01->super_TPZChunkVector<TPZCompEl_*,_10>);
  for (local_10 = in_RDI[0x10]; local_10 < iVar1; local_10 = local_10 + 1) {
    ppTVar2 = TPZChunkVector<TPZCompEl_*,_10>::operator[]
                        ((TPZChunkVector<TPZCompEl_*,_10> *)
                         CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8));
    pTVar6 = *ppTVar2;
    if (pTVar6 != (TPZCompEl *)0x0) {
      ::TPZStructMatrix::MaterialIds((TPZStructMatrix *)*in_RDI);
      sVar3 = std::set<int,_std::less<int>,_std::allocator<int>_>::size
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)0x1d79185);
      if (sVar3 == 0) break;
      psVar4 = ::TPZStructMatrix::MaterialIds((TPZStructMatrix *)*in_RDI);
      uVar5 = (**(code **)(*(long *)pTVar6 + 0x88))(pTVar6,psVar4);
      if ((uVar5 & 1) != 0) break;
    }
  }
  in_RDI[0x10] = local_10 + 1;
  if (local_10 < iVar1) {
    std::set<int,_std::less<int>,_std::allocator<int>_>::insert
              ((set<int,_std::less<int>,_std::allocator<int>_> *)
               CONCAT44((int)local_10,in_stack_ffffffffffffffc0),
               (value_type_conflict4 *)CONCAT71(in_stack_ffffffffffffffb9,in_stack_ffffffffffffffb8)
              );
  }
  std::mutex::unlock((mutex *)0x1d79233);
  return local_10;
}

Assistant:

int64_t 
TPZStructMatrixOR<TVar>::ThreadData::NextElement() {
    fMutexAccessElement.lock();
    int64_t iel;
    int64_t nextel = fNextElement;
    TPZCompMesh *cmesh = fStruct->Mesh();
    TPZAdmChunkVector<TPZCompEl *> &elementvec = cmesh->ElementVec();
    int64_t nel = elementvec.NElements();
    for (iel = fNextElement; iel < nel; iel++) {
        TPZCompEl *el = elementvec[iel];
        if (!el) continue;
        if (fStruct->MaterialIds().size() == 0) break;
        if (el->NeedsComputing(fStruct->MaterialIds())) break;
    }
    fNextElement = iel + 1;
    nextel = iel;
    if (iel < nel) fProcessed.insert(iel); //AQUIBORIN pelo que percebi, aqui tem que acontecer antes do unlock no caso sem Critical Section
    fMutexAccessElement.unlock();
#ifdef PZ_LOG
    {
        if (logger.isDebugEnabled()) {
            std::stringstream sout;
            sout << __PRETTY_FUNCTION__ << " returning " << nextel << " fNextElement " << fNextElement;
            LOGPZ_DEBUG(logger, sout.str())
        }
    }
#endif
    return nextel;
}